

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O3

bool __thiscall
ON_HistoryRecord::SetObjRefValues(ON_HistoryRecord *this,int value_id,int count,ON_ObjRef *oref)

{
  ON_ClassArray<ON_ObjRef> *this_00;
  undefined8 *puVar1;
  bool bVar2;
  ON_UUID uuid;
  bool bVar3;
  int iVar4;
  ON_Value *pOVar5;
  ON_ObjRef *this_01;
  ON_ObjRef_IRefID *pOVar6;
  long lVar7;
  long lVar8;
  ON_UUID uuid_00;
  ON_UUID object_id;
  ON_UUID local_48;
  ON_UuidList *local_38;
  
  pOVar5 = FindValueHelper(this,value_id,9,true);
  if (pOVar5 != (ON_Value *)0x0) {
    this_00 = (ON_ClassArray<ON_ObjRef> *)(pOVar5 + 1);
    ON_ClassArray<ON_ObjRef>::SetCapacity(this_00,0);
    if (*(uint *)((long)&pOVar5[2]._vptr_ON_Value + 4) < (uint)count) {
      ON_ClassArray<ON_ObjRef>::SetCapacity(this_00,(long)count);
    }
    else if (count == 0) goto LAB_00557d87;
    if (oref == (ON_ObjRef *)0x0) {
      bVar2 = false;
    }
    else {
      bVar2 = 0 < (oref->m__iref).m_count;
    }
    if (0 < count) {
      local_38 = &this->m_antecedents;
      lVar7 = 0;
      do {
        this_01 = ON_ClassArray<ON_ObjRef>::AppendNew(this_00);
        ON_ObjRef::operator=(this_01,(ON_ObjRef *)((oref->m_uuid).Data4 + lVar7 + -8));
        ON_ObjRef::DecrementProxyReferenceCount(this_01);
        this_01->m_runtime_sn = 0;
        if (!bVar2) {
          puVar1 = (undefined8 *)(*(long *)&pOVar5[1].m_value_id + lVar7);
          local_48._0_8_ = *puVar1;
          local_48.Data4 = *(uchar (*) [8])(puVar1 + 1);
          bVar3 = ON_UuidIsNil(&local_48);
          if (!bVar3) {
            uuid.Data4[0] = local_48.Data4[0];
            uuid.Data4[1] = local_48.Data4[1];
            uuid.Data4[2] = local_48.Data4[2];
            uuid.Data4[3] = local_48.Data4[3];
            uuid.Data4[4] = local_48.Data4[4];
            uuid.Data4[5] = local_48.Data4[5];
            uuid.Data4[6] = local_48.Data4[6];
            uuid.Data4[7] = local_48.Data4[7];
            uuid.Data1 = local_48.Data1;
            uuid.Data2 = local_48.Data2;
            uuid.Data3 = local_48.Data3;
            ON_UuidList::AddUuid(local_38,uuid,true);
          }
        }
        lVar7 = lVar7 + 0xe0;
      } while ((ulong)(uint)count * 0xe0 - lVar7 != 0);
    }
    if (bVar2) {
      iVar4 = (oref->m__iref).m_count;
      pOVar6 = (oref->m__iref).m_a + iVar4;
      if (pOVar6 != (ON_ObjRef_IRefID *)0x190 && 0 < (long)iVar4) {
        ON_UuidList::AddUuid(&this->m_antecedents,pOVar6[-1].m_iref_uuid,true);
        iVar4 = (oref->m__iref).m_count;
      }
      if (0 < iVar4) {
        lVar7 = 0x98;
        lVar8 = 0;
        do {
          pOVar6 = (oref->m__iref).m_a;
          uuid_00.Data4 = *(uchar (*) [8])((pOVar6->m_iref_uuid).Data4 + lVar7 + -8);
          uuid_00._0_8_ = *(undefined8 *)((pOVar6->m_iref_uuid).Data4 + lVar7 + -0x10);
          ON_UuidList::AddUuid(&this->m_antecedents,uuid_00,true);
          lVar8 = lVar8 + 1;
          lVar7 = lVar7 + 400;
        } while (lVar8 < (oref->m__iref).m_count);
      }
    }
  }
LAB_00557d87:
  return pOVar5 != (ON_Value *)0x0;
}

Assistant:

bool ON_HistoryRecord::SetObjRefValues( int value_id, int count, const ON_ObjRef* oref)
{
  ON_ObjRefValue* v = static_cast<ON_ObjRefValue*>(FindValueHelper(value_id,ON_Value::objref_value,true));
  if ( v )
  {
    v->m_value.Destroy();
    v->m_value.Reserve(count);

    if(count)
    {
      // 2019-01-23 - kike@mcneel.com
      // Objects in instance definitions can not be modified in that case
      // I add the root instance reference and all the instance definitions as 'antecedents'
      const bool idef_geometry = oref && (oref->m__iref.Count() > 0);

      for(int i = 0; i < count; i++)
      {
        // The call to DecrementProxyReferenceCount() is critical.
        // It makes sure there are no active runtime pointers 
        // saved in the history record.  If this call is not here,
        // you will eventually crash and history update will never
        // work right even when it doesn't crash.
        ON_ObjRef& vor = v->m_value.AppendNew();
        vor = oref[i];
        vor.DecrementProxyReferenceCount();
        // Feb 12 2010 - Fixing bug in ExtrudeCrv history
        //  and probably lots of other subtle history bugs.
        //  History must lookup by UUID and not by runtime serial number.
        vor.m_runtime_sn = 0;

        // 2019-01-23 - kike@mcneel.com
        if(!idef_geometry)
        {
          ON_UUID object_id = v->m_value[i].m_uuid;
          if(!ON_UuidIsNil(object_id))
          {
            m_antecedents.AddUuid(object_id);
          }
        }
      }

      // 2019-01-23 - kike@mcneel.com
      if(idef_geometry)
      {
        if(auto iref = oref->m__iref.Last())
          m_antecedents.AddUuid(iref->m_iref_uuid);

        for(int r = 0; r < oref->m__iref.Count(); ++r)
          m_antecedents.AddUuid(oref->m__iref[r].m_idef_uuid);
      }
    }
  }
  return (0 != v);
}